

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O0

string_view __thiscall
absl::lts_20250127::ByString::Find(ByString *this,string_view text,size_t pos)

{
  ByString *pBVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  size_type __pos;
  const_pointer pvVar5;
  size_type sVar6;
  undefined1 auVar7 [16];
  string_view sVar8;
  size_t found_pos;
  size_t pos_local;
  ByString *this_local;
  string_view text_local;
  char *local_10;
  
  text_local._M_len = (size_t)text._M_str;
  this_local = (ByString *)text._M_len;
  lVar3 = std::__cxx11::string::length();
  sVar2 = text_local._M_len;
  pBVar1 = this_local;
  if (lVar3 == 1) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)this);
    __pos = std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,*pcVar4,pos);
    if (__pos == 0xffffffffffffffff) {
      pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&text_local._M_str,
                 pvVar5 + sVar6,0);
    }
    else {
      join_0x00000010_0x00000000_ =
           std::basic_string_view<char,_std::char_traits<char>_>::substr
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,__pos,1);
    }
  }
  else {
    auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
    join_0x00000010_0x00000000_ =
         anon_unknown_5::GenericFind<absl::lts_20250127::(anonymous_namespace)::LiteralPolicy>
                   ((anon_unknown_5 *)pBVar1,sVar2,auVar7._0_8_,auVar7._8_8_,pos);
  }
  sVar8._M_len = (size_t)text_local._M_str;
  sVar8._M_str = local_10;
  return sVar8;
}

Assistant:

absl::string_view ByString::Find(absl::string_view text, size_t pos) const {
  if (delimiter_.length() == 1) {
    // Much faster to call find on a single character than on an
    // absl::string_view.
    size_t found_pos = text.find(delimiter_[0], pos);
    if (found_pos == absl::string_view::npos)
      return absl::string_view(text.data() + text.size(), 0);
    return text.substr(found_pos, 1);
  }
  return GenericFind(text, delimiter_, pos, LiteralPolicy());
}